

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usetiter.cpp
# Opt level: O1

UBool __thiscall icu_63::UnicodeSetIterator::next(UnicodeSetIterator *this)

{
  UVector *this_00;
  int iVar1;
  UnicodeString *pUVar2;
  
  iVar1 = this->nextElement;
  if (this->endElement < iVar1) {
    if (this->endRange <= this->range) {
      iVar1 = this->nextString;
      if (this->stringCount <= iVar1) {
        return '\0';
      }
      this->codepoint = -1;
      this_00 = this->set->strings;
      this->nextString = iVar1 + 1;
      pUVar2 = (UnicodeString *)UVector::elementAt(this_00,iVar1);
      goto LAB_002f1003;
    }
    this->range = this->range + 1;
    (*(this->super_UObject)._vptr_UObject[3])(this);
    iVar1 = this->nextElement;
  }
  this->nextElement = iVar1 + 1;
  this->codepointEnd = iVar1;
  this->codepoint = iVar1;
  pUVar2 = (UnicodeString *)0x0;
LAB_002f1003:
  this->string = pUVar2;
  return '\x01';
}

Assistant:

UBool UnicodeSetIterator::next() {
    if (nextElement <= endElement) {
        codepoint = codepointEnd = nextElement++;
        string = NULL;
        return TRUE;
    }
    if (range < endRange) {
        loadRange(++range);
        codepoint = codepointEnd = nextElement++;
        string = NULL;
        return TRUE;
    }

    if (nextString >= stringCount) return FALSE;
    codepoint = (UChar32)IS_STRING; // signal that value is actually a string
    string = (const UnicodeString*) set->strings->elementAt(nextString++);
    return TRUE;
}